

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setop_relation.cpp
# Opt level: O3

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::SetOpRelation::GetQueryNode(SetOpRelation *this)

{
  SetOperationType SVar1;
  bool bVar2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  SetOperationNode *this_00;
  pointer pSVar5;
  Relation *pRVar6;
  long in_RSI;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_30;
  _Head_base<0UL,_duckdb::SetOperationNode_*,_false> local_28;
  
  this_00 = (SetOperationNode *)operator_new(0x90);
  SetOperationNode::SetOperationNode(this_00);
  local_28._M_head_impl = this_00;
  if (*(char *)(in_RSI + 0xa8) == '\0') {
    pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
             ::operator->((unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
                           *)&local_28);
    local_30._M_head_impl = (QueryNode *)operator_new(0x28);
    (local_30._M_head_impl)->type = BOUND_SUBQUERY_NODE;
    (local_30._M_head_impl)->_vptr_QueryNode = (_func_int **)&PTR__DistinctModifier_024434a8;
    ((local_30._M_head_impl)->modifiers).
    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_30._M_head_impl)->modifiers).
    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_30._M_head_impl)->modifiers).
    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&(pSVar5->super_QueryNode).modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)&local_30);
    if (local_30._M_head_impl != (QueryNode *)0x0) {
      (*(local_30._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pRVar6 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x68));
  (*pRVar6->_vptr_Relation[3])(&local_30,pRVar6);
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
                         *)&local_28);
  _Var4._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (QueryNode *)0x0;
  _Var3._M_head_impl =
       (pSVar5->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar5->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_30._M_head_impl != (QueryNode *)0x0) {
      (*(local_30._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pRVar6 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x78));
  (*pRVar6->_vptr_Relation[3])(&local_30,pRVar6);
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
                         *)&local_28);
  _Var4._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (QueryNode *)0x0;
  _Var3._M_head_impl =
       (pSVar5->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar5->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_30._M_head_impl != (QueryNode *)0x0) {
      (*(local_30._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  SVar1 = *(SetOperationType *)(in_RSI + 0x88);
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
                         *)&local_28);
  pSVar5->setop_type = SVar1;
  bVar2 = *(bool *)(in_RSI + 0xa8);
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
                         *)&local_28);
  pSVar5->setop_all = bVar2;
  (this->super_Relation)._vptr_Relation = (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> SetOpRelation::GetQueryNode() {
	auto result = make_uniq<SetOperationNode>();
	if (!setop_all) {
		result->modifiers.push_back(make_uniq<DistinctModifier>());
	}
	result->left = left->GetQueryNode();
	result->right = right->GetQueryNode();
	result->setop_type = setop_type;
	result->setop_all = setop_all;
	return std::move(result);
}